

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::scan
               (CallIndirector *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  SIMDExtract *pSVar2;
  ArrayInit *pAVar3;
  SIMDLoad *pSVar4;
  GlobalSet *pGVar5;
  AtomicCmpxchg *pAVar6;
  Return *pRVar7;
  MemoryCopy *pMVar8;
  AtomicWait *pAVar9;
  TupleMake *pTVar10;
  Load *pLVar11;
  CallRef *pCVar12;
  Call *pCVar13;
  StructNew *pSVar14;
  ArrayNew *pAVar15;
  ArrayNewFixed *pAVar16;
  Expression **ppEVar17;
  Break *pBVar18;
  Switch *pSVar19;
  CallIndirect *pCVar20;
  Try *pTVar21;
  Store *pSVar22;
  Throw *pTVar23;
  MemoryGrow *pMVar24;
  StringNew *pSVar25;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  Expression **currp_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_01;
  Expression **currp_02;
  Expression **currp_03;
  Name *currp_04;
  Expression **currp_05;
  Expression **currp_06;
  Expression **currp_07;
  PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_> *pPVar26;
  ulong uVar27;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar27 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pBVar1->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case IfId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitIf,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)&pMVar8->size,currp_02);
    goto LAB_00af8337;
  case LoopId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLoop,currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00af7e5e;
  case BreakId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBreak,currp);
    pBVar18 = Expression::cast<wasm::Break>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)&pBVar18->condition,currp_00);
    ppEVar17 = &pBVar18->value;
    currp_01 = extraout_RDX_01;
    goto LAB_00af7e30;
  case SwitchId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSwitch,currp);
    pSVar19 = Expression::cast<wasm::Switch>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pSVar19->condition);
    ppEVar17 = &pSVar19->value;
    currp_01 = extraout_RDX_02;
    goto LAB_00af7e30;
  case CallId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitCall,currp);
    pCVar13 = Expression::cast<wasm::Call>(this);
    uVar27 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case CallIndirectId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitCallIndirect,
               currp);
    pCVar20 = Expression::cast<wasm::CallIndirect>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pCVar20->target);
    uVar27 = (ulong)(uint)(pCVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar20->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case LocalGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLocalGet,currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLocalSet,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00af81ab;
  case GlobalGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitGlobalGet,currp)
    ;
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitGlobalSet,currp)
    ;
    pGVar5 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00af7e5e;
  case LoadId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitLoad,currp);
    pLVar11 = Expression::cast<wasm::Load>(this);
    ppEVar17 = &pLVar11->ptr;
    break;
  case StoreId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStore,currp);
    pSVar22 = Expression::cast<wasm::Store>(this);
    goto LAB_00af816e;
  case ConstId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitUnary,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::Unary>(this);
    goto LAB_00af81ab;
  case BinaryId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBinary,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00af83ae;
  case SelectId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSelect,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00af7ec3;
  case DropId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitDrop,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::Drop>(this);
    goto LAB_00af8383;
  case ReturnId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitReturn,currp);
    pRVar7 = Expression::cast<wasm::Return>(this);
    ppEVar17 = &pRVar7->value;
    currp_01 = extraout_RDX;
    goto LAB_00af7e30;
  case MemorySizeId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemorySize,currp
              );
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryGrow,currp
              );
    pMVar24 = Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00af8383;
  case NopId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicRMW,currp)
    ;
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00af8235;
  case AtomicCmpxchgId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicCmpxchg,
               currp);
    pAVar6 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00af8218;
  case AtomicWaitId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicWait,currp
              );
    pAVar9 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00af7b52;
  case AtomicNotifyId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00af83ae;
  case AtomicFenceId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar2 = Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00af81ab;
  case SIMDReplaceId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    currp_04 = (Name *)&pAVar9->timeout;
    goto LAB_00af83bc;
  case SIMDShuffleId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00af8337;
  case SIMDTernaryId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00af7b52;
  case SIMDShiftId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDShift,currp)
    ;
    pAVar9 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00af83ae;
  case SIMDLoadId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitSIMDLoad,currp);
    pSVar4 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00af8031;
  case SIMDLoadStoreLaneId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar22 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00af816e:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pSVar22->value);
    ppEVar17 = &pSVar22->ptr;
    break;
  case MemoryInitId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryInit,currp
              );
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
LAB_00af8218:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pAVar6->replacement);
    goto LAB_00af8235;
  case DataDropId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitDataDrop,currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryCopy,currp
              );
    pMVar8 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00af7ec3;
  case MemoryFillId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitMemoryFill,currp
              );
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00af7ec3;
  case PopId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefNull,currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefIsNull,currp)
    ;
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00af8383;
  case RefFuncId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefFunc,currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefEq,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00af8337;
  case TableGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableGet,currp);
    pGVar5 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00af7e5e:
    ppEVar17 = &pGVar5->value;
    break;
  case TableSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableSet,currp);
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00af8235;
  case TableSizeId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableSize,currp)
    ;
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTableGrow,currp)
    ;
    pAVar6 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
LAB_00af8235:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pAVar6->expected);
    ppEVar17 = &pAVar6->ptr;
    break;
  case TryId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTry,currp);
    pTVar21 = Expression::cast<wasm::Try>(this);
    uVar27 = (ulong)(uint)(pTVar21->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar21->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    ppEVar17 = &pTVar21->body;
    break;
  case ThrowId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitThrow,currp);
    pTVar23 = Expression::cast<wasm::Throw>(this);
    uVar27 = (ulong)(uint)(pTVar23->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar23->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case RethrowId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRethrow,currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case TupleMakeId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTupleMake,currp)
    ;
    pTVar10 = Expression::cast<wasm::TupleMake>(this);
    uVar27 = (ulong)(uint)(pTVar10->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pTVar10->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case TupleExtractId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitTupleExtract,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00af8383;
  case I31NewId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitI31New,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31New>(this);
    goto LAB_00af8383;
  case I31GetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitI31Get,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00af8383;
  case CallRefId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitCallRef,currp);
    pCVar12 = Expression::cast<wasm::CallRef>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pCVar12->target);
    uVar27 = (ulong)(uint)(pCVar12->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pCVar12->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case RefTestId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefTest,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00af8383;
  case RefCastId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefCast,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00af8383;
  case BrOnId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitBrOn,currp);
    pSVar4 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00af8031:
    ppEVar17 = &pSVar4->ptr;
    break;
  case StructNewId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStructNew,currp)
    ;
    pSVar14 = Expression::cast<wasm::StructNew>(this);
    uVar27 = (ulong)(uint)(pSVar14->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pSVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case StructGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStructGet,currp)
    ;
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StructGet>(this);
    goto LAB_00af81ab;
  case StructSetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStructSet,currp)
    ;
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00af83ae;
  case ArrayNewId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayNew,currp);
    pAVar15 = Expression::cast<wasm::ArrayNew>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pAVar15->size);
    ppEVar17 = &pAVar15->init;
    currp_01 = extraout_RDX_00;
LAB_00af7e30:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)ppEVar17,currp_01);
    return;
  case ArrayNewSegId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayNewSeg,
               currp);
    pAVar3 = (ArrayInit *)Expression::cast<wasm::ArrayNewSeg>(this);
    goto LAB_00af7cf3;
  case ArrayNewFixedId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayNewFixed,
               currp);
    pAVar16 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar27 = (ulong)(uint)(pAVar16->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar27) {
      uVar27 = uVar27 - 1;
      ppEVar17 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                           (&(pAVar16->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            ,uVar27);
      Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
                (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
                 ppEVar17);
    }
    return;
  case ArrayGetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayGet,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00af8337;
  case ArraySetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArraySet,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00af7ec3;
  case ArrayLenId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayLen,currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00af8383;
  case ArrayCopyId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayCopy,currp)
    ;
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&(pMVar8->destMemory).super_IString.str._M_str);
    goto LAB_00af7b03;
  case ArrayFillId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayFill,currp)
    ;
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00af7b03:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pMVar8->destMemory);
    goto LAB_00af7ec3;
  case ArrayInitId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitArrayInit,currp)
    ;
    pAVar3 = Expression::cast<wasm::ArrayInit>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pAVar3->size);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pAVar3->offset);
LAB_00af7cf3:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pAVar3->index);
    ppEVar17 = &pAVar3->ref;
    break;
  case RefAsId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitRefAs,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00af81ab;
  case StringNewId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringNew,currp)
    ;
    pSVar25 = Expression::cast<wasm::StringNew>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)&pSVar25->end,currp_05);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)&pSVar25->start,currp_06);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)&pSVar25->length,currp_07);
    ppEVar17 = &pSVar25->ptr;
    break;
  case StringConstId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringMeasure,
               currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringMeasure>(this);
    goto LAB_00af81ab;
  case StringEncodeId:
    pPVar26 = &(self->
               super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
               ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>;
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringEncode,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::maybePushTask
              (&pPVar26->super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               (TaskFunc)&pAVar9->timeout,currp_03);
    currp_04 = (Name *)&pAVar9->expected;
    goto LAB_00af83bc;
  case StringConcatId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringConcat,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00af8337;
  case StringEqId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringEq,currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
    goto LAB_00af83ae;
  case StringAsId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringAs,currp);
    pSVar2 = (SIMDExtract *)Expression::cast<wasm::StringAs>(this);
LAB_00af81ab:
    ppEVar17 = &pSVar2->vec;
    break;
  case StringWTF8AdvanceId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::
               doVisitStringWTF8Advance,currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF8Advance>(this);
LAB_00af7ec3:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pMVar8->size);
    goto LAB_00af8337;
  case StringWTF16GetId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringWTF16Get,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00af8337;
  case StringIterNextId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringIterNext,
               currp);
    pMVar24 = (MemoryGrow *)Expression::cast<wasm::StringIterNext>(this);
LAB_00af8383:
    ppEVar17 = &pMVar24->delta;
    break;
  case StringIterMoveId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringIterMove,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringIterMove>(this);
LAB_00af83ae:
    currp_04 = (Name *)&pAVar9->expected;
LAB_00af83bc:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)currp_04);
    ppEVar17 = &pAVar9->ptr;
    break;
  case StringSliceWTFId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringSliceWTF,
               currp);
    pAVar9 = (AtomicWait *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00af7b52:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               (Expression **)&pAVar9->timeout);
    currp_04 = (Name *)&pAVar9->expected;
    goto LAB_00af83bc;
  case StringSliceIterId:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,
               Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::doVisitStringSliceIter,
               currp);
    pMVar8 = (MemoryCopy *)Expression::cast<wasm::StringSliceIter>(this);
LAB_00af8337:
    Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
                ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
                super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,
               &pMVar8->source);
    ppEVar17 = &pMVar8->dest;
    break;
  default:
    return;
  }
  Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>::pushTask
            (&(self->
              super_WalkerPass<wasm::PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>_>
              ).super_PostWalker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>.
              super_Walker<CallIndirector,_wasm::Visitor<CallIndirector,_void>_>,scan,ppEVar17);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }